

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Matcher<const_std::tr1::tuple<const_char_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
* testing::A<std::tr1::tuple<char_const*,void,void,void,void,void,void,void,void,void>const&>(void)

{
  MatcherInterface<const_std::tr1::tuple<const_char_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  *pMVar1;
  Matcher<const_std::tr1::tuple<const_char_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  *in_RDI;
  
  pMVar1 = (MatcherInterface<const_std::tr1::tuple<const_char_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
            *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001ba5a0;
  (in_RDI->
  super_MatcherBase<const_std::tr1::tuple<const_char_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  ).impl_.value_ = pMVar1;
  (in_RDI->
  super_MatcherBase<const_std::tr1::tuple<const_char_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  ).impl_.link_.next_ =
       &(in_RDI->
        super_MatcherBase<const_std::tr1::tuple<const_char_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
        ).impl_.link_;
  (in_RDI->
  super_MatcherBase<const_std::tr1::tuple<const_char_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001ba568;
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }